

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignmentExpressions.cpp
# Opt level: O0

ConstantValue * __thiscall
slang::ast::AssignmentExpression::evalImpl(AssignmentExpression *this,EvalContext *context)

{
  SourceRange range;
  bool bVar1;
  SourceLocation SVar2;
  Expression *pEVar3;
  long in_RDX;
  SourceLocation in_RSI;
  EvalContext *in_RDI;
  EvalContext *in_stack_00000028;
  Expression *in_stack_00000030;
  StreamingConcatenationExpression *in_stack_00000038;
  EvalContext *in_stack_00000040;
  SimpleAssignmentPatternExpression *in_stack_00000048;
  ConstantValue rvalue;
  LValue lvalue;
  SimpleAssignmentPatternExpression *in_stack_fffffffffffffd78;
  EvalContext *in_stack_fffffffffffffd80;
  Expression *in_stack_fffffffffffffd88;
  uint in_stack_fffffffffffffde4;
  DiagCode code;
  ConstantValue *in_stack_ffffffffffffff78;
  LValue *in_stack_ffffffffffffff80;
  bitmask<slang::ast::EvalFlags> local_19 [25];
  
  SVar2 = (SourceLocation)(in_RDX + 0x38);
  bitmask<slang::ast::EvalFlags>::bitmask(local_19,IsScript);
  bVar1 = bitmask<slang::ast::EvalFlags>::has
                    ((bitmask<slang::ast::EvalFlags> *)in_stack_fffffffffffffd80,
                     (bitmask<slang::ast::EvalFlags> *)in_stack_fffffffffffffd78);
  code = (DiagCode)(in_stack_fffffffffffffde4 & 0xffffff);
  if (!bVar1) {
    code._0_3_ = (undefined3)in_stack_fffffffffffffde4;
    code.code._1_1_ = *(long *)((long)in_RSI + 0x38) != 0;
  }
  if (code.code._1_1_ == '\0') {
    pEVar3 = left((AssignmentExpression *)in_RSI);
    if (pEVar3->kind == Streaming) {
      pEVar3 = left((AssignmentExpression *)in_RSI);
      Expression::as<slang::ast::StreamingConcatenationExpression>(pEVar3);
      right((AssignmentExpression *)in_RSI);
      Bitstream::evaluateTarget(in_stack_00000038,in_stack_00000030,in_stack_00000028);
    }
    else {
      left((AssignmentExpression *)in_RSI);
      Expression::evalLValue(in_stack_fffffffffffffd88,in_stack_fffffffffffffd80);
      bVar1 = LValue::operator_cast_to_bool((LValue *)0x7e42f7);
      if (bVar1) {
        bVar1 = isCompound((AssignmentExpression *)0x7e434a);
        if (bVar1) {
          EvalContext::pushLValue(in_stack_fffffffffffffd80,(LValue *)in_stack_fffffffffffffd78);
        }
        right((AssignmentExpression *)in_RSI);
        Expression::eval(in_stack_fffffffffffffd88,in_stack_fffffffffffffd80);
        bVar1 = isCompound((AssignmentExpression *)0x7e43aa);
        if (bVar1) {
          EvalContext::popLValue((EvalContext *)0x7e43c7);
        }
        bVar1 = slang::ConstantValue::operator_cast_to_bool((ConstantValue *)0x7e43fe);
        if (bVar1) {
          pEVar3 = left((AssignmentExpression *)in_RSI);
          if (pEVar3->kind == SimpleAssignmentPattern) {
            in_stack_fffffffffffffd80 = (EvalContext *)left((AssignmentExpression *)in_RSI);
            in_stack_fffffffffffffd78 =
                 Expression::as<slang::ast::SimpleAssignmentPatternExpression>
                           ((Expression *)in_stack_fffffffffffffd80);
            SimpleAssignmentPatternExpression::applyConversions
                      (in_stack_00000048,in_stack_00000040,(ConstantValue *)in_stack_00000038);
            slang::ConstantValue::operator=
                      ((ConstantValue *)in_stack_fffffffffffffd80,
                       (ConstantValue *)in_stack_fffffffffffffd78);
            slang::ConstantValue::~ConstantValue((ConstantValue *)0x7e44a6);
          }
          LValue::store(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
          slang::ConstantValue::ConstantValue
                    ((ConstantValue *)in_stack_fffffffffffffd80,
                     (ConstantValue *)in_stack_fffffffffffffd78);
        }
        else {
          slang::ConstantValue::ConstantValue
                    ((ConstantValue *)in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
        }
        slang::ConstantValue::~ConstantValue((ConstantValue *)0x7e44e7);
      }
      else {
        slang::ConstantValue::ConstantValue
                  ((ConstantValue *)in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
      }
      LValue::~LValue((LValue *)0x7e44f4);
    }
  }
  else {
    range.endLoc = SVar2;
    range.startLoc = in_RSI;
    EvalContext::addDiag(in_RDI,code,range);
    slang::ConstantValue::ConstantValue
              ((ConstantValue *)in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
  }
  return (ConstantValue *)in_RDI;
}

Assistant:

ConstantValue AssignmentExpression::evalImpl(EvalContext& context) const {
    if (!context.flags.has(EvalFlags::IsScript) && timingControl) {
        context.addDiag(diag::ConstEvalTimedStmtNotConst, sourceRange);
        return nullptr;
    }

    if (left().kind == ExpressionKind::Streaming) {
        return Bitstream::evaluateTarget(left().as<StreamingConcatenationExpression>(), right(),
                                         context);
    }

    LValue lvalue = left().evalLValue(context);
    if (!lvalue)
        return nullptr;

    if (isCompound())
        context.pushLValue(lvalue);

    ConstantValue rvalue = right().eval(context);

    if (isCompound())
        context.popLValue();

    if (!rvalue)
        return nullptr;

    // If the LHS is an assignment pattern we need to manually apply any conversions
    // to the elements of the RHS since there's no other place to do it.
    if (left().kind == ExpressionKind::SimpleAssignmentPattern)
        rvalue = left().as<SimpleAssignmentPatternExpression>().applyConversions(context, rvalue);

    lvalue.store(rvalue);
    return rvalue;
}